

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int wiz_levport_or_tut_rev(void)

{
  if (flags.debug == '\0') {
    if (flags.tutorial == '\0') {
      pline("Tutorial review is only available in tutorial mode.");
    }
    else {
      tutorial_redisplay();
    }
  }
  else {
    level_tele();
  }
  return 0;
}

Assistant:

static int wiz_levport_or_tut_rev(void)
{
	if (wizard)
	    level_tele();
	else if (flags.tutorial)
	    tutorial_redisplay();
	else
	    pline("Tutorial review is only available in tutorial mode.");
	return 0;
}